

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_kernel_c.h
# Opt level: O0

T * __thiscall
dlib::
queue_kernel_c<dlib::queue_kernel_1<dlib::file,_dlib::memory_manager_stateless_kernel_1<char>_>_>::
element(queue_kernel_c<dlib::queue_kernel_1<dlib::file,_dlib::memory_manager_stateless_kernel_1<char>_>_>
        *this)

{
  int iVar1;
  ostream *poVar2;
  ostream *poVar3;
  string *a;
  undefined8 uVar4;
  file *pfVar5;
  queue_kernel_1<dlib::file,_dlib::memory_manager_stateless_kernel_1<char>_> *in_RDI;
  ostringstream dlib_o_out;
  error_type t;
  ostream local_180;
  
  iVar1 = (*(in_RDI->super_enumerable<dlib::file>)._vptr_enumerable[4])();
  if (((byte)iVar1 & 1) != 1) {
    dlib_assert_breakpoint();
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_180);
    poVar2 = std::operator<<(&local_180,"\n\nError detected at line ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x9a);
    std::operator<<(poVar2,".\n");
    poVar2 = std::operator<<(&local_180,"Error detected in file ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/e-fominov[P]dlib/dlib/gui_widgets/../gui_core/../threads/../queue/queue_kernel_c.h"
                            );
    std::operator<<(poVar2,".\n");
    poVar2 = std::operator<<(&local_180,"Error detected in function ");
    poVar2 = std::operator<<(poVar2,
                             "virtual typename queue_base::type &dlib::queue_kernel_c<dlib::queue_kernel_1<dlib::file>>::element() [queue_base = dlib::queue_kernel_1<dlib::file>]"
                            );
    std::operator<<(poVar2,".\n\n");
    poVar2 = std::operator<<(&local_180,"Failing expression was ");
    poVar2 = std::operator<<(poVar2,"this->current_element_valid() == true");
    std::operator<<(poVar2,".\n");
    poVar2 = (ostream *)std::ostream::operator<<(&local_180,std::boolalpha);
    poVar3 = std::operator<<(poVar2,"\tT& queue::element");
    a = (string *)
        std::operator<<(poVar3,"\n\tyou can\'t access the current element if it doesn\'t exist");
    t = (error_type)((ulong)poVar3 >> 0x20);
    poVar3 = std::operator<<((ostream *)a,"\n\tthis: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,in_RDI);
    std::operator<<(poVar3,"\n");
    uVar4 = __cxa_allocate_exception(0x30);
    std::__cxx11::ostringstream::str();
    fatal_error::fatal_error((fatal_error *)poVar2,t,a);
    __cxa_throw(uVar4,&fatal_error::typeinfo,fatal_error::~fatal_error);
  }
  pfVar5 = queue_kernel_1<dlib::file,_dlib::memory_manager_stateless_kernel_1<char>_>::element
                     (in_RDI);
  return pfVar5;
}

Assistant:

typename queue_base::type& queue_kernel_c<queue_base>::
    element (
    ) 
    {
        // make sure requires clause is not broken
        DLIB_CASSERT(this->current_element_valid() == true,
            "\tT& queue::element"
            << "\n\tyou can't access the current element if it doesn't exist"
            << "\n\tthis: " << this
            );

        // call the real function
        return queue_base::element();
    }